

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

xmlChar * xmlTextReaderGetAttributeNs
                    (xmlTextReaderPtr reader,xmlChar *localName,xmlChar *namespaceURI)

{
  int iVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlNs *pxVar4;
  xmlChar *ret;
  xmlChar *local_30;
  
  local_30 = (xmlChar *)0x0;
  if ((((localName == (xmlChar *)0x0 || reader == (xmlTextReaderPtr)0x0) ||
       (reader->node == (xmlNodePtr)0x0)) || (reader->curnode != (xmlNodePtr)0x0)) ||
     (reader->node->type != XML_ELEMENT_NODE)) {
    local_30 = (xmlChar *)0x0;
  }
  else {
    iVar1 = xmlStrEqual(namespaceURI,(xmlChar *)"http://www.w3.org/2000/xmlns/");
    if (iVar1 != 0) {
      iVar1 = xmlStrEqual(localName,"xmlns");
      pxVar4 = (xmlNs *)&reader->node->nsDef;
LAB_001718d7:
      do {
        pxVar4 = pxVar4->next;
        if (pxVar4 == (xmlNs *)0x0) {
          return (xmlChar *)0x0;
        }
        pxVar3 = pxVar4->prefix;
        if (iVar1 == 0) {
          if (pxVar3 == (xmlChar *)0x0) goto LAB_001718d7;
        }
        else if (pxVar3 == (xmlChar *)0x0) goto LAB_00171901;
        iVar2 = xmlStrEqual(pxVar3,localName);
        if (iVar2 != 0) {
LAB_00171901:
          pxVar3 = readerStrdup(reader,pxVar4->href);
          return pxVar3;
        }
      } while( true );
    }
    iVar1 = xmlNodeGetAttrValue(reader->node,localName,namespaceURI,&local_30);
    if (iVar1 < 0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return local_30;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNs(xmlTextReaderPtr reader, const xmlChar *localName,
			    const xmlChar *namespaceURI) {
    xmlChar *ret = NULL;
    xmlChar *prefix = NULL;
    xmlNsPtr ns;
    int result;

    if ((reader == NULL) || (localName == NULL))
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);

    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    if (xmlStrEqual(namespaceURI, BAD_CAST "http://www.w3.org/2000/xmlns/")) {
        if (! xmlStrEqual(localName, BAD_CAST "xmlns")) {
            prefix = BAD_CAST localName;
        }
        ns = reader->node->nsDef;
        while (ns != NULL) {
            if ((prefix == NULL && ns->prefix == NULL) ||
                ((ns->prefix != NULL) && (xmlStrEqual(ns->prefix, localName)))) {
                return readerStrdup(reader, ns->href);
            }
            ns = ns->next;
        }
        return NULL;
    }

    result = xmlNodeGetAttrValue(reader->node, localName, namespaceURI, &ret);
    if (result < 0)
        xmlTextReaderErrMemory(reader);

    return(ret);
}